

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covBuild.c
# Opt level: O2

Abc_Obj_t * Abc_NtkCovDeriveNodeInv_rec(Cov_Man_t *p,Abc_Ntk_t *pNtkNew,Abc_Obj_t *pObj,int fCompl)

{
  int i;
  Vec_Int_t *vSupp;
  Min_Cube_t *pCover;
  Abc_Obj_t *pFanin;
  char *pcVar1;
  Abc_Obj_t *pAVar2;
  int iVar3;
  
  if ((pObj->field_6).pTemp == (void *)0x0) {
    if ((*(uint *)&pObj->field_0x14 & 0xf) != 7) {
      __assert_fail("Abc_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/cov/covBuild.c"
                    ,0x136,
                    "Abc_Obj_t *Abc_NtkCovDeriveNodeInv_rec(Cov_Man_t *, Abc_Ntk_t *, Abc_Obj_t *, int)"
                   );
    }
    vSupp = Abc_ObjGetSupp(pObj);
    pCover = Abc_ObjGetCover2(pObj);
    if (vSupp == (Vec_Int_t *)0x0) {
      __assert_fail("vSupp",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/cov/covBuild.c"
                    ,0x13b,
                    "Abc_Obj_t *Abc_NtkCovDeriveNodeInv_rec(Cov_Man_t *, Abc_Ntk_t *, Abc_Obj_t *, int)"
                   );
    }
    for (iVar3 = 0; iVar3 < vSupp->nSize; iVar3 = iVar3 + 1) {
      i = Vec_IntEntry(vSupp,iVar3);
      pAVar2 = Abc_NtkObj(pObj->pNtk,i);
      Abc_NtkCovDeriveNodeInv_rec(p,pNtkNew,pAVar2,0);
    }
    iVar3 = Min_CoverCountCubes(pCover);
    if (iVar3 == 1) {
      pAVar2 = Abc_NtkCovDeriveCubeInv(pNtkNew,pObj,pCover,vSupp);
    }
    else if (iVar3 == 0) {
      pAVar2 = Abc_NtkCreateNodeConst0(pNtkNew);
    }
    else {
      pAVar2 = Abc_NtkCreateNode(pNtkNew);
      for (; pCover != (Min_Cube_t *)0x0; pCover = pCover->pNext) {
        pFanin = Abc_NtkCovDeriveCubeInv(pNtkNew,pObj,pCover,vSupp);
        Abc_ObjAddFanin(pAVar2,pFanin);
      }
      pcVar1 = Abc_SopCreateXorSpecial((Mem_Flex_t *)pNtkNew->pManFunc,iVar3);
      (pAVar2->field_5).pData = pcVar1;
    }
    (pObj->field_6).pCopy = pAVar2;
  }
  pAVar2 = Abc_NtkCovDeriveInv(pNtkNew,pObj,fCompl);
  return pAVar2;
}

Assistant:

Abc_Obj_t * Abc_NtkCovDeriveNodeInv_rec( Cov_Man_t * p, Abc_Ntk_t * pNtkNew, Abc_Obj_t * pObj, int fCompl )
{
    Min_Cube_t * pCover, * pCube;
    Abc_Obj_t * pFaninNew, * pNodeNew, * pFanin;
    Vec_Int_t * vSupp;
    int Entry, nCubes, i;

    // skip if already computed
    if ( pObj->pCopy )
        return Abc_NtkCovDeriveInv( pNtkNew, pObj, fCompl );
    assert( Abc_ObjIsNode(pObj) );

    // get the support and the cover
    vSupp  = Abc_ObjGetSupp( pObj ); 
    pCover = Abc_ObjGetCover2( pObj );
    assert( vSupp );

    // process the fanins
    Vec_IntForEachEntry( vSupp, Entry, i )
    {
        pFanin = Abc_NtkObj(pObj->pNtk, Entry);
        Abc_NtkCovDeriveNodeInv_rec( p, pNtkNew, pFanin, 0 );
    }

    // for each cube, construct the node
    nCubes = Min_CoverCountCubes( pCover );
    if ( nCubes == 0 )
        pNodeNew = Abc_NtkCreateNodeConst0(pNtkNew);
    else if ( nCubes == 1 )
        pNodeNew = Abc_NtkCovDeriveCubeInv( pNtkNew, pObj, pCover, vSupp );
    else
    {
        pNodeNew = Abc_NtkCreateNode( pNtkNew );
        Min_CoverForEachCube( pCover, pCube )
        {
            pFaninNew = Abc_NtkCovDeriveCubeInv( pNtkNew, pObj, pCube, vSupp );
            Abc_ObjAddFanin( pNodeNew, pFaninNew );
        }
        pNodeNew->pData = Abc_SopCreateXorSpecial( (Mem_Flex_t *)pNtkNew->pManFunc, nCubes );
    }

    pObj->pCopy = pNodeNew;
    return Abc_NtkCovDeriveInv( pNtkNew, pObj, fCompl );
}